

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
identifier_classification::operator<<
          (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,word_class c)

{
  wostream *pwVar1;
  
  if (c < 4) {
    pwVar1 = std::operator<<(os,&DAT_0018af74 + *(int *)(&DAT_0018af74 + (ulong)c * 4));
    return pwVar1;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_parser.cpp"
                ,0x20c,
                "std::basic_ostream<CharT> &identifier_classification::operator<<(std::basic_ostream<CharT> &, word_class) [CharT = wchar_t]"
               );
}

Assistant:

std::basic_ostream<CharT>& operator<<(std::basic_ostream<CharT>& os, word_class c) {
    switch (c) {
    case none:      return os << "none";
    case keyword:   return os << "keyword";
    case reserved:  return os << "reserved";
    case strict:    return os << "strict";
    }
    assert(false);
    return os << "word_class{" << static_cast<int>(c) << "}";
}